

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O0

X509CertificateExtension *
QTlsPrivate::X509CertificateOpenSSL::convertExtension(X509_EXTENSION *ext)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ASN1_OBJECT *pAVar4;
  X509CertificateExtension *in_RDI;
  long in_FS_OFFSET;
  ASN1_OBJECT *obj;
  X509CertificateExtension *result;
  QVariant extensionValue;
  X509_EXTENSION *in_stack_ffffffffffffff18;
  X509CertificateExtension *object;
  X509_EXTENSION *in_stack_ffffffffffffff80;
  QVariant local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  object = in_RDI;
  memset(in_RDI,0xaa,0x58);
  X509CertificateBase::X509CertificateExtension::X509CertificateExtension(in_RDI);
  pAVar4 = q_X509_EXTENSION_get_object(in_stack_ffffffffffffff18);
  if (pAVar4 != (ASN1_OBJECT *)0x0) {
    anon_unknown_2::asn1ObjectId((ASN1_OBJECT *)in_RDI);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QString::operator=(&in_RDI->oid,(QString *)in_stack_ffffffffffffff18);
    QString::~QString((QString *)0x13b25a);
    QByteArray::~QByteArray((QByteArray *)0x13b264);
    anon_unknown_2::asn1ObjectName((ASN1_OBJECT *)object);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QString::operator=(&in_RDI->oid,(QString *)in_stack_ffffffffffffff18);
    QString::~QString((QString *)0x13b29f);
    QByteArray::~QByteArray((QByteArray *)0x13b2a9);
    iVar3 = q_X509_EXTENSION_get_critical(in_stack_ffffffffffffff18);
    object->critical = iVar3 != 0;
    anon_unknown_2::x509ExtensionToValue((X509_EXTENSION *)0xaaaaaaaaaaaaaaaa);
    bVar2 = QVariant::isValid((QVariant *)in_RDI);
    if (bVar2) {
      QVariant::operator=(&object->value,(QVariant *)&stack0xffffffffffffffd8);
      object->supported = true;
    }
    else {
      anon_unknown_2::x509UnknownExtensionToValue(in_stack_ffffffffffffff80);
      QVariant::operator=((QVariant *)object,(QVariant *)in_RDI);
      QVariant::~QVariant(&local_48);
      bVar2 = QVariant::isValid((QVariant *)in_RDI);
      if (bVar2) {
        QVariant::operator=(&object->value,(QVariant *)&stack0xffffffffffffffd8);
      }
      object->supported = false;
    }
    QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

X509CertificateBase::X509CertificateExtension X509CertificateOpenSSL::convertExtension(X509_EXTENSION *ext)
{
    Q_ASSERT(ext);

    X509CertificateExtension result;

    ASN1_OBJECT *obj = q_X509_EXTENSION_get_object(ext);
    if (!obj)
        return result;

    result.oid = QString::fromUtf8(asn1ObjectId(obj));
    result.name = QString::fromUtf8(asn1ObjectName(obj));

    result.critical = bool(q_X509_EXTENSION_get_critical(ext));

    // Lets see if we have custom support for this one
    QVariant extensionValue = x509ExtensionToValue(ext);
    if (extensionValue.isValid()) {
        result.value = extensionValue;
        result.supported = true;
        return result;
    }

    extensionValue = x509UnknownExtensionToValue(ext);
    if (extensionValue.isValid())
        result.value = extensionValue;

    result.supported = false;

    return result;
}